

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O3

ze_result_t
validation_layer::zeDriverGetLastErrorDescription(ze_driver_handle_t hDriver,char **ppString)

{
  code *pcVar1;
  long lVar2;
  long *plVar3;
  ze_result_t result;
  ze_result_t zVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar7 = *(long *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"zeDriverGetLastErrorDescription(hDriver, ppString)","");
  if (*(char *)(lVar7 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(lVar7 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar1 = *(code **)(context + 0xd0);
  if (pcVar1 == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar7 = *(long *)(context + 0xd30);
    lVar2 = *(long *)(context + 0xd38);
    lVar5 = lVar2 - lVar7 >> 3;
    if (lVar2 != lVar7) {
      lVar6 = 0;
      do {
        plVar3 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + lVar6 * 8);
        result = (**(code **)(*plVar3 + 0x80))(plVar3,hDriver,ppString);
        if (result != ZE_RESULT_SUCCESS) goto LAB_0014abac;
        lVar6 = lVar6 + 1;
      } while (lVar5 + (ulong)(lVar5 == 0) != lVar6);
    }
    lVar6 = context;
    if (((*(char *)(context + 4) != '\x01') ||
        (result = ZEHandleLifetimeValidation::zeDriverGetLastErrorDescriptionPrologue
                            (*(ZEHandleLifetimeValidation **)(context + 0xd48),hDriver,ppString),
        result == ZE_RESULT_SUCCESS)) &&
       (zVar4 = (*pcVar1)(hDriver,ppString), result = zVar4, lVar2 != lVar7)) {
      lVar7 = 0;
      do {
        plVar3 = (long *)**(undefined8 **)(*(long *)(lVar6 + 0xd30) + lVar7 * 8);
        result = (**(code **)(*plVar3 + 0x88))(plVar3,hDriver,ppString,zVar4);
        if (result != ZE_RESULT_SUCCESS) break;
        lVar7 = lVar7 + 1;
        result = zVar4;
      } while (lVar5 + (ulong)(lVar5 == 0) != lVar7);
    }
  }
LAB_0014abac:
  logAndPropagateResult("zeDriverGetLastErrorDescription",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDriverGetLastErrorDescription(
        ze_driver_handle_t hDriver,                     ///< [in] handle of the driver instance
        const char** ppString                           ///< [in,out] pointer to a null-terminated array of characters describing
                                                        ///< cause of error.
        )
    {
        context.logger->log_trace("zeDriverGetLastErrorDescription(hDriver, ppString)");

        auto pfnGetLastErrorDescription = context.zeDdiTable.Driver.pfnGetLastErrorDescription;

        if( nullptr == pfnGetLastErrorDescription )
            return logAndPropagateResult("zeDriverGetLastErrorDescription", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeDriverGetLastErrorDescriptionPrologue( hDriver, ppString );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeDriverGetLastErrorDescription", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeDriverGetLastErrorDescriptionPrologue( hDriver, ppString );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeDriverGetLastErrorDescription", result);
        }

        auto driver_result = pfnGetLastErrorDescription( hDriver, ppString );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeDriverGetLastErrorDescriptionEpilogue( hDriver, ppString ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeDriverGetLastErrorDescription", result);
        }

        return logAndPropagateResult("zeDriverGetLastErrorDescription", driver_result);
    }